

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  char *dice_string;
  anon_union_8_5_62f3dbed_for_which aVar4;
  int iVar5;
  wchar_t wVar6;
  player *ppVar7;
  wchar_t radius;
  source origin;
  source origin_00;
  source origin_01;
  source origin_02;
  source origin_03;
  
  uVar2 = Rand_div(3);
  if (-4 < (int)uVar2) {
    iVar5 = uVar2 + 5;
    do {
      if (context->obj->pval * 2 < (player->state).skills[3]) {
        uVar2 = Rand_div(6);
        ppVar7 = player;
        if (uVar2 == 0) {
          wVar3 = damroll(5,0x14);
          take_hit(ppVar7,wVar3,"a chest dispel-player trap");
        }
        else {
          uVar2 = Rand_div(5);
          if (uVar2 == 0) {
            wVar6 = L'\b';
            wVar3 = L'È';
            ppVar7 = player;
          }
          else {
            uVar2 = Rand_div(4);
            if (uVar2 != 0) {
              uVar2 = Rand_div(3);
              if (uVar2 == 0) {
                origin._0_8_ = (ulong)(context->origin).what;
                aVar4 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                wVar3 = L'0';
                dice_string = "0";
                wVar6 = L'\0';
                radius = L'\0';
              }
              else {
                uVar2 = Rand_div(2);
                origin._0_8_ = CONCAT44(0,(context->origin).what);
                aVar4 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                if (uVar2 == 0) {
                  origin.which.trap = aVar4.trap;
                  effect_simple(L'\x11',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_00._4_4_ = 0;
                  origin_00.what = (context->origin).what;
                  origin_00.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_00,"0",L'\x01',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_01._4_4_ = 0;
                  origin_01.what = (context->origin).what;
                  origin_01.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_01,"0",L'\x02',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin_02._4_4_ = 0;
                  origin_02.what = (context->origin).what;
                  origin_02.which.trap = (context->origin).which.trap;
                  effect_simple(L'\x11',origin_02,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
                  origin._0_8_ = (ulong)(context->origin).what;
                  aVar4 = (anon_union_8_5_62f3dbed_for_which)(context->origin).which.trap;
                  wVar3 = L'\x11';
                  dice_string = "0";
                  wVar6 = L'\x04';
                  radius = L'\0';
                }
                else {
                  wVar3 = L'M';
                  dice_string = "150";
                  wVar6 = L'\n';
                  radius = L'\x01';
                }
              }
              origin_03.which.trap = aVar4.trap;
              origin_03._0_8_ = origin._0_8_;
              effect_simple(wVar3,origin_03,dice_string,wVar6,radius,L'\0',L'\0',L'\0',(_Bool *)0x0)
              ;
              goto LAB_00142615;
            }
            _Var1 = player_of_has(player,L'\x0f');
            ppVar7 = player;
            if (_Var1) {
              uVar2 = Rand_div(100);
              wVar3 = uVar2 + L'\n';
              wVar6 = L'\t';
            }
            else {
              uVar2 = Rand_div(6);
              wVar3 = uVar2 + L'\x02';
              wVar6 = L'\x03';
            }
          }
          player_inc_timed(ppVar7,wVar6,wVar3,true,true,true);
        }
      }
LAB_00142615:
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return false;
}

Assistant:

bool effect_handler_RUNES_OF_EVIL(effect_handler_context_t *context)
{
	/* Determine how many nasty tricks can be played. */
	int nasty_tricks_count = 4 + randint0(3);

	/* This is gonna hurt... */
	for (; nasty_tricks_count > 0; nasty_tricks_count--) {
		/* ...but a high saving throw does help a little. */
		if (2 * context->obj->pval < player->state.skills[SKILL_SAVE]) {
			if (one_in_(6)) {
				take_hit(player, damroll(5, 20), "a chest dispel-player trap");
			} else if (one_in_(5)) {
				player_inc_timed(player, TMD_CUT, 200, true, true, true);
			} else if (one_in_(4)) {
				if (!player_of_has(player, OF_FREE_ACT)) {
					player_inc_timed(player, TMD_PARALYZED, 2 + randint0(6),
									 true, true, true);
				} else {
					player_inc_timed(player, TMD_STUN, 10 + randint0(100),
									 true, true, true);
				}
			} else if (one_in_(3)) {
				effect_simple(EF_DISENCHANT, context->origin, "0", 0, 0, 0, 0, 0, NULL);
			} else if (one_in_(2)) {
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_STR, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_INT, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_WIS, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_DEX, 0, 0, 0, 0, NULL);
				effect_simple(EF_DRAIN_STAT, context->origin, "0", STAT_CON, 0, 0, 0, 0, NULL);
			} else {
				effect_simple(EF_CLOUD, context->origin, "150", PROJ_NETHER, 1, 0, 0, 0, NULL);
			}
		}
	}

	return false;
}